

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::SetNestedFunc
          (ParseableFunctionInfo *this,FunctionInfo *nestedFunc,uint index,uint32 flags)

{
  NestedArray *pNVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionInfoArray pTVar6;
  
  pNVar1 = (this->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = pNVar1->nestedCount;
  }
  if (uVar4 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7e2,"(index < this->GetNestedCount())",
                                "Trying to write past the nested func array");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pTVar6 = GetNestedFuncArray(this);
  pTVar6 = pTVar6 + index;
  Memory::Recycler::WBSetBit((char *)pTVar6);
  pTVar6->ptr = nestedFunc;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar6);
  return;
}

Assistant:

void ParseableFunctionInfo::SetNestedFunc(FunctionInfo* nestedFunc, uint index, uint32 flags)
    {
        AssertMsg(index < this->GetNestedCount(), "Trying to write past the nested func array");

        FunctionInfoArray nested = this->GetNestedFuncArray();
        nested[index] = nestedFunc;
    }